

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O0

bool __thiscall
BayesianGameBase::AreCachedJointToIndivIndices(BayesianGameBase *this,PolicyDomainCategory pdc)

{
  bool bVar1;
  undefined8 uVar2;
  int in_ESI;
  BayesianGameBase *in_RDI;
  E *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (in_ESI == 0) {
    bVar1 = CacheJointToIndivType_Indices(in_RDI);
  }
  else if (in_ESI == 1) {
    bVar1 = CacheJointToIndivOH_Indices(in_RDI);
  }
  else {
    if (in_ESI != 2) {
      uVar2 = __cxa_allocate_exception(0x28);
      E::E(unaff_retaddr,(char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      __cxa_throw(uVar2,&E::typeinfo,E::~E);
    }
    bVar1 = CacheJointToIndivAOH_Indices(in_RDI);
  }
  return bVar1;
}

Assistant:

bool BayesianGameBase::AreCachedJointToIndivIndices(
    const PolicyGlobals::PolicyDomainCategory pdc) const 
{
    switch ( pdc )
    {
    case PolicyGlobals::OHIST_INDEX :
        return CacheJointToIndivOH_Indices();
        break;
    case PolicyGlobals::AOHIST_INDEX :
        return CacheJointToIndivAOH_Indices();
        break;
    case PolicyGlobals::TYPE_INDEX : 
        return CacheJointToIndivType_Indices();
        break;
    default:
        throw(E("Used a JointPolicyDiscrete::PolicyGlobals::PolicyDomainCategory unknown to BayesianGameBase!"));
        break;
    }				/* -----  end switch  ----- */
}